

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

int __thiscall
UnifiedRegex::BeginLoopFixedInst::Print
          (BeginLoopFixedInst *this,DebugWriter *w,Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  char16 *litbuf_00;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_015d347d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",0x17);
  }
  DebugWriter::Print(w,L"BeginLoopFixed");
  DebugWriter::Print(w,L"(");
  BeginLoopMixin::Print(&this->super_BeginLoopMixin,w,litbuf_00);
  DebugWriter::Print(w,L", ");
  DebugWriter::Print(w,L"length: %u",(ulong)(this->super_FixedLengthMixin).length);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_015d347d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::BeginLoopMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_BeginLoopMixin,L"BeginLoopMixin");
    Inst::PrintBytes<UnifiedRegex::FixedLengthMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_FixedLengthMixin,
               L"FixedLengthMixin");
    DebugWriter::Unindent(w);
  }
  return 0x17;
}

Assistant:

int BeginLoopFixedInst::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        PRINT_RE_BYTECODE_BEGIN("BeginLoopFixed");
        PRINT_MIXIN_COMMA(BeginLoopMixin);
        PRINT_MIXIN(FixedLengthMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(BeginLoopMixin);
        PRINT_BYTES(FixedLengthMixin);
        PRINT_RE_BYTECODE_END();
    }